

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dogmove.c
# Opt level: O3

boolean can_reach_location(monst *mon,xchar mx,xchar my,xchar fx,xchar fy)

{
  uint y0;
  xchar x;
  boolean bVar1;
  int iVar2;
  uint x0;
  int iVar3;
  int x1;
  undefined7 in_register_00000009;
  int iVar4;
  undefined7 in_register_00000031;
  int x0_00;
  xchar y;
  bool bVar5;
  
  x1 = (int)CONCAT71(in_register_00000009,fx);
  bVar1 = '\x01';
  if (my != fy || mx != fx) {
    if ((byte)my < 0x15 && (byte)(mx - 1U) < 0x4f) {
      x0_00 = (int)CONCAT71(in_register_00000031,mx);
      iVar2 = dist2(x0_00,(uint)(byte)my,x1,(int)fy);
      x0 = x0_00 - 1;
      do {
        iVar4 = -1;
        x = (xchar)x0;
        do {
          y0 = (uint)(byte)my + iVar4;
          if ((((y0 < 0x15 && x0 - 1 < 0x4f) && (iVar3 = dist2(x0,y0,x1,(int)fy), iVar3 < iVar2)) &&
              (((y = (xchar)y0, '\x10' < level->locations[x0][y0].typ ||
                ((mon->data->mflags1 & 8) != 0)) ||
               ((bVar1 = may_dig(level,x,y), bVar1 != '\0' && ((mon->data->mflags1 & 0x20) != 0)))))
              ) && (((level->locations[x0][y0].typ != '\x17' ||
                     ((level->locations[x0][y0].field_0x6 & 0xc0) == 0)) &&
                    ((bVar1 = could_reach_item(mon,x,y), bVar1 != '\0' &&
                     (bVar1 = can_reach_location(mon,x,y,fx,fy), bVar1 != '\0')))))) {
            return '\x01';
          }
          iVar4 = iVar4 + 1;
        } while (iVar4 != 2);
        bVar5 = x0 != x0_00 + 1U;
        x0 = x0 + 1;
      } while (bVar5);
    }
    bVar1 = '\0';
  }
  return bVar1;
}

Assistant:

static boolean can_reach_location(struct monst *mon,
				  xchar mx, xchar my, xchar fx, xchar fy)
{
    int i, j;
    int dist;

    if (mx == fx && my == fy) return TRUE;
    if (!isok(mx, my)) return FALSE; /* should not happen */
    
    dist = dist2(mx, my, fx, fy);
    for (i=mx-1; i<=mx+1; i++) {
	for (j=my-1; j<=my+1; j++) {
	    if (!isok(i, j))
		continue;
	    if (dist2(i, j, fx, fy) >= dist)
		continue;
	    if (IS_ROCK(level->locations[i][j].typ) && !passes_walls(mon->data) &&
				    (!may_dig(level, i,j) || !tunnels(mon->data)))
		continue;
	    if (IS_DOOR(level->locations[i][j].typ) &&
				(level->locations[i][j].doormask & (D_CLOSED | D_LOCKED)))
		continue;
	    if (!could_reach_item(mon, i, j))
		continue;
	    if (can_reach_location(mon, i, j, fx, fy))
		return TRUE;
	}
    }
    return FALSE;
}